

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.hpp
# Opt level: O0

double ear::hoa::sph_harm<double(*)(int,int)>(int n,int m,double az,double el,norm_f_t *norm)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double local_30;
  double scale;
  norm_f_t *norm_local;
  double el_local;
  double az_local;
  int m_local;
  int n_local;
  
  if (m < 1) {
    if (m < 0) {
      dVar2 = sqrt(2.0);
      local_30 = sin((double)m * az);
      local_30 = -dVar2 * local_30;
    }
    else {
      local_30 = 1.0;
    }
  }
  else {
    local_30 = sqrt(2.0);
    dVar2 = cos((double)m * az);
    local_30 = local_30 * dVar2;
  }
  iVar1 = m;
  if (m < 1) {
    iVar1 = -m;
  }
  dVar2 = (*norm)(n,iVar1);
  if (m < 1) {
    m = -m;
  }
  dVar3 = sin(el);
  dVar3 = Alegendre(n,m,dVar3);
  return dVar2 * dVar3 * local_30;
}

Assistant:

double sph_harm(int n, int m, double az, double el, NormT norm) {
      double scale;
      if (m > 0)
        scale = std::sqrt(2.0) * std::cos(m * az);
      else if (m < 0)
        scale = -std::sqrt(2.0) * std::sin(m * az);
      else
        scale = 1;

      return norm(n, std::abs(m)) * Alegendre(n, std::abs(m), std::sin(el)) *
             scale;
    }